

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

void __thiscall tlx::CmdlineParser::print_result(CmdlineParser *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Argument *pAVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  long *plVar7;
  size_type *psVar8;
  pointer ppAVar9;
  string typestr;
  allocator local_a9;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long local_68;
  undefined4 local_5c;
  long *local_58 [2];
  long local_48 [2];
  ulong local_38;
  
  local_38 = this->option_max_width_;
  if (this->option_max_width_ < this->param_max_width_) {
    local_38 = this->param_max_width_;
  }
  local_5c = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  cVar4 = (char)os;
  if ((this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Parameters:",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    ppAVar9 = (this->param_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppAVar9 !=
        (this->param_list_).
        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_68 = (long)(int)local_38;
      paVar1 = &local_a8.field_2;
      do {
        pAVar2 = *ppAVar9;
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        lVar3 = *(long *)os;
        *(long *)(os + *(long *)(lVar3 + -0x18) + 0x10) = local_68;
        lVar3 = *(long *)(lVar3 + -0x18);
        *(uint *)(os + lVar3 + 0x18) = *(uint *)(os + lVar3 + 0x18) & 0xffffff4f | 0x20;
        Argument::param_text_abi_cxx11_(&local_a8,pAVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        iVar5 = (*pAVar2->_vptr_Argument[2])(pAVar2);
        std::__cxx11::string::string
                  ((string *)local_58,(char *)CONCAT44(extraout_var,iVar5),&local_a9);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x153310);
        local_88 = &local_78;
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_78 = *plVar7;
          lStack_70 = plVar6[3];
        }
        else {
          local_78 = *plVar7;
          local_88 = (long *)*plVar6;
        }
        local_80 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_a8.field_2._M_allocated_capacity = *psVar8;
          local_a8.field_2._8_8_ = plVar6[3];
          local_a8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar8;
          local_a8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_a8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0x14;
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        (*pAVar2->_vptr_Argument[4])(pAVar2,os);
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        ppAVar9 = ppAVar9 + 1;
      } while (ppAVar9 !=
               (this->param_list_).
               super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if ((this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Options:",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    ppAVar9 = (this->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppAVar9 !=
        (this->option_list_).
        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_68 = (long)(int)local_38;
      paVar1 = &local_a8.field_2;
      do {
        pAVar2 = *ppAVar9;
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        lVar3 = *(long *)os;
        *(long *)(os + *(long *)(lVar3 + -0x18) + 0x10) = local_68;
        lVar3 = *(long *)(lVar3 + -0x18);
        *(uint *)(os + lVar3 + 0x18) = *(uint *)(os + lVar3 + 0x18) & 0xffffff4f | 0x20;
        Argument::option_text_abi_cxx11_(&local_a8,pAVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        iVar5 = (*pAVar2->_vptr_Argument[2])(pAVar2);
        std::__cxx11::string::string
                  ((string *)local_58,(char *)CONCAT44(extraout_var_00,iVar5),&local_a9);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x153310);
        local_88 = &local_78;
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_78 = *plVar7;
          lStack_70 = plVar6[3];
        }
        else {
          local_78 = *plVar7;
          local_88 = (long *)*plVar6;
        }
        local_80 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_a8.field_2._M_allocated_capacity = *psVar8;
          local_a8.field_2._8_8_ = plVar6[3];
          local_a8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar8;
          local_a8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_a8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        lVar3 = *(long *)os;
        *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 0x10) = 0x14;
        lVar3 = *(long *)(lVar3 + -0x18);
        *(uint *)(os + lVar3 + 0x18) = *(uint *)(os + lVar3 + 0x18) & 0xffffff4f | 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        (*pAVar2->_vptr_Argument[4])(pAVar2,os);
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        ppAVar9 = ppAVar9 + 1;
      } while (ppAVar9 !=
               (this->option_list_).
               super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = local_5c;
  return;
}

Assistant:

void CmdlineParser::print_result(std::ostream& os) {
    std::ios::fmtflags flags(os.flags());

    size_t maxlong = std::max(param_max_width_, option_max_width_);

    if (!param_list_.empty()) {
        os << "Parameters:" << std::endl;

        for (ArgumentList::const_iterator it = param_list_.begin();
             it != param_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(maxlong))
               << std::left << arg->param_text();

            std::string typestr = "(" + std::string(arg->type_name()) + ")";
            os << std::setw(max_type_name_ + 4) << typestr;

            arg->print_value(os);

            os << std::endl;
        }
    }

    if (!option_list_.empty()) {
        os << "Options:" << std::endl;

        for (ArgumentList::const_iterator it = option_list_.begin();
             it != option_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(maxlong))
               << std::left << arg->option_text();

            std::string typestr = "(" + std::string(arg->type_name()) + ")";
            os << std::setw(max_type_name_ + 4) << std::left << typestr;

            arg->print_value(os);

            os << std::endl;
        }
    }

    os.flags(flags);
}